

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O0

Index wasm::Bits::getMaxBits<wasm::OptimizeInstructions>
                (Expression *curr,OptimizeInstructions *localInfoProvider)

{
  bool bVar1;
  BasicType BVar2;
  int32_t iVar3;
  Index IVar4;
  Index IVar5;
  int64_t iVar6;
  Index *pIVar7;
  uint *puVar8;
  LocalSet *pLVar9;
  LocalGet *get_00;
  Load *load_00;
  Index local_28c;
  Index local_288;
  Index local_284;
  Index local_280;
  Index local_27c;
  Load *load;
  LocalGet *get;
  LocalSet *set;
  Index maxBits_9;
  Index maxBits_8;
  Index maxBits_7;
  Index maxBits_6;
  Index maxBits_5;
  Unary *local_220;
  Unary *unary;
  uint local_210;
  Index local_20c;
  uint local_208;
  Index local_204;
  uint shifts_5;
  Index maxBits_4;
  Const *shift_3;
  uint local_1f0;
  Index local_1ec;
  uint local_1e8;
  Index local_1e4;
  uint shifts_4;
  Index maxBits_3;
  Const *shift_2;
  uint local_1d0;
  Index local_1cc;
  Const *pCStack_1c8;
  Index maxBits_2;
  Const *shifts_3;
  Index local_1b8;
  Index local_1b4;
  uint local_1b0;
  Index local_1ac;
  Index bitsRight_7;
  Index maxBitsLeft_11;
  Const *c_8;
  Index bitsRight_6;
  Index maxBitsLeft_10;
  Const *c_7;
  int local_188;
  Index local_184;
  Const *pCStack_180;
  int32_t bitsRight_5;
  Const *c_6;
  int local_170;
  int32_t maxBitsLeft_9;
  Index local_168;
  Index local_164;
  int32_t bitsRight_4;
  int32_t maxBitsLeft_8;
  Const *c_5;
  uint local_150;
  Index local_14c;
  Index local_148;
  Index maxBitsLeft_7;
  Index maxBitsRight_3;
  Index local_13c;
  Index local_138;
  Index maxBitsRight_2;
  Index maxBitsLeft_6;
  Index local_12c;
  uint local_128;
  Index local_124;
  uint shifts_2;
  Index maxBits_1;
  Const *shift_1;
  uint local_110;
  Index local_10c;
  uint local_108;
  Index local_104;
  uint shifts_1;
  Index maxBits;
  Const *shift;
  Const *local_f0;
  Const *shifts;
  Index local_e0;
  Index local_dc;
  uint local_d8;
  Index local_d4;
  Index bitsRight_3;
  Index maxBitsLeft_5;
  Const *c_4;
  Index bitsRight_2;
  Index maxBitsLeft_4;
  Const *c_3;
  int local_b0;
  Index local_ac;
  Const *pCStack_a8;
  int32_t bitsRight_1;
  Const *c_2;
  int local_98;
  int32_t maxBitsLeft_3;
  Index local_90;
  Index local_8c;
  int32_t bitsRight;
  int32_t maxBitsLeft_2;
  Const *c_1;
  Index local_78;
  Index local_74;
  Index maxBitsLeft_1;
  Index maxBitsRight_1;
  Index local_68;
  Index local_64;
  Index maxBitsRight;
  Index maxBitsLeft;
  Binary *binary;
  Literal local_40;
  Const *local_28;
  Const *c;
  OptimizeInstructions *localInfoProvider_local;
  Expression *curr_local;
  
  c = (Const *)localInfoProvider;
  localInfoProvider_local = (OptimizeInstructions *)curr;
  bVar1 = Properties::emitsBoolean(curr);
  if (bVar1) {
    return 1;
  }
  local_28 = Expression::dynCast<wasm::Const>((Expression *)localInfoProvider_local);
  if (local_28 != (Const *)0x0) {
    BVar2 = wasm::Type::getBasic
                      ((Type *)&(localInfoProvider_local->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).super_Pass.runner);
    if (BVar2 == i32) {
      wasm::Literal::countLeadingZeroes(&local_40,&local_28->value);
      iVar3 = wasm::Literal::geti32(&local_40);
      curr_local._4_4_ = 0x20 - iVar3;
      wasm::Literal::~Literal(&local_40);
      return curr_local._4_4_;
    }
    if (BVar2 != i64) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                         ,0x8b);
    }
    wasm::Literal::countLeadingZeroes((Literal *)&binary,&local_28->value);
    iVar6 = wasm::Literal::geti64((Literal *)&binary);
    curr_local._4_4_ = 0x40 - (int)iVar6;
    wasm::Literal::~Literal((Literal *)&binary);
    return curr_local._4_4_;
  }
  _maxBitsRight = Expression::dynCast<wasm::Binary>((Expression *)localInfoProvider_local);
  if (_maxBitsRight == (Binary *)0x0) {
    local_220 = Expression::dynCast<wasm::Unary>((Expression *)localInfoProvider_local);
    if (local_220 == (Unary *)0x0) {
      pLVar9 = Expression::dynCast<wasm::LocalSet>((Expression *)localInfoProvider_local);
      if (pLVar9 != (LocalSet *)0x0) {
        IVar5 = getMaxBits<wasm::OptimizeInstructions>(pLVar9->value,(OptimizeInstructions *)c);
        return IVar5;
      }
      get_00 = Expression::dynCast<wasm::LocalGet>((Expression *)localInfoProvider_local);
      if (get_00 != (LocalGet *)0x0) {
        if (c == (Const *)0x0) {
          __assert_fail("localInfoProvider",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                        ,0x1a3,
                        "Index wasm::Bits::getMaxBits(Expression *, LocalInfoProvider *) [LocalInfoProvider = wasm::OptimizeInstructions]"
                       );
        }
        IVar5 = OptimizeInstructions::getMaxBitsForLocal((OptimizeInstructions *)c,get_00);
        return IVar5;
      }
      load_00 = Expression::dynCast<wasm::Load>((Expression *)localInfoProvider_local);
      if (((load_00 != (Load *)0x0) && (bVar1 = LoadUtils::isSignRelevant(load_00), bVar1)) &&
         ((load_00->signed_ & 1U) == 0)) {
        return (uint)load_00->bytes << 3;
      }
    }
    else {
      switch(local_220->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
        return 6;
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
        return 7;
      default:
        break;
      case EqZInt32:
      case EqZInt64:
        handle_unreachable("relationals handled before",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                           ,0x182);
      case ExtendSInt32:
      case ExtendS32Int64:
        local_28c = getMaxBits<wasm::OptimizeInstructions>
                              (local_220->value,(OptimizeInstructions *)c);
        if (0x1f < local_28c) {
          local_28c = 0x40;
        }
        return local_28c;
      case ExtendUInt32:
      case WrapInt64:
        maxBits_5 = 0x20;
        maxBits_6 = getMaxBits<wasm::OptimizeInstructions>
                              (local_220->value,(OptimizeInstructions *)c);
        puVar8 = std::min<unsigned_int>(&maxBits_5,&maxBits_6);
        return *puVar8;
      case ExtendS8Int32:
        local_27c = getMaxBits<wasm::OptimizeInstructions>
                              (local_220->value,(OptimizeInstructions *)c);
        if (7 < local_27c) {
          local_27c = 0x20;
        }
        return local_27c;
      case ExtendS16Int32:
        local_280 = getMaxBits<wasm::OptimizeInstructions>
                              (local_220->value,(OptimizeInstructions *)c);
        if (0xf < local_280) {
          local_280 = 0x20;
        }
        return local_280;
      case ExtendS8Int64:
        local_284 = getMaxBits<wasm::OptimizeInstructions>
                              (local_220->value,(OptimizeInstructions *)c);
        if (7 < local_284) {
          local_284 = 0x40;
        }
        return local_284;
      case ExtendS16Int64:
        local_288 = getMaxBits<wasm::OptimizeInstructions>
                              (local_220->value,(OptimizeInstructions *)c);
        if (0xf < local_288) {
          local_288 = 0x40;
        }
        return local_288;
      }
    }
  }
  else {
    switch(_maxBitsRight->op) {
    case AddInt32:
      local_64 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_68 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->right,(OptimizeInstructions *)c);
      maxBitsRight_1 = 0x20;
      puVar8 = std::max<unsigned_int>(&local_64,&local_68);
      maxBitsLeft_1 = *puVar8 + 1;
      puVar8 = std::min<unsigned_int>(&maxBitsRight_1,&maxBitsLeft_1);
      return *puVar8;
    case SubInt32:
    case RotLInt32:
    case RotRInt32:
      return 0x20;
    case MulInt32:
      local_74 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->right,(OptimizeInstructions *)c);
      local_78 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->left,(OptimizeInstructions *)c);
      c_1._4_4_ = 0x20;
      c_1._0_4_ = local_78 + local_74;
      puVar8 = std::min<unsigned_int>((uint *)((long)&c_1 + 4),(uint *)&c_1);
      return *puVar8;
    case DivSInt32:
      _bitsRight = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight == (Const *)0x0) {
        return 0x20;
      }
      local_8c = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->left,(OptimizeInstructions *)c);
      if ((local_8c != 0x20) && (iVar3 = wasm::Literal::geti32(&_bitsRight->value), -1 < iVar3)) {
        local_90 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                             ((Expression *)_bitsRight,(DummyLocalInfoProvider *)0x0);
        maxBitsLeft_3 = 0;
        local_98 = (local_8c - local_90) + 1;
        pIVar7 = (Index *)std::max<int>(&maxBitsLeft_3,&local_98);
        return *pIVar7;
      }
      return 0x20;
    case DivUInt32:
      c_2._4_4_ = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      pCStack_a8 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (pCStack_a8 == (Const *)0x0) {
        return c_2._4_4_;
      }
      local_ac = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                           ((Expression *)pCStack_a8,(DummyLocalInfoProvider *)0x0);
      local_b0 = 0;
      c_3._4_4_ = (c_2._4_4_ - local_ac) + 1;
      pIVar7 = (Index *)std::max<int>(&local_b0,(int *)((long)&c_3 + 4));
      return *pIVar7;
    case RemSInt32:
      _bitsRight_2 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight_2 == (Const *)0x0) {
        return 0x20;
      }
      c_4._4_4_ = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      if (c_4._4_4_ != 0x20) {
        iVar3 = wasm::Literal::geti32(&_bitsRight_2->value);
        c_4._0_4_ = ceilLog2(iVar3);
        puVar8 = std::min<unsigned_int>((uint *)((long)&c_4 + 4),(uint *)&c_4);
        return *puVar8;
      }
      return 0x20;
    case RemUInt32:
      _bitsRight_3 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight_3 == (Const *)0x0) {
        return 0x20;
      }
      local_d4 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->left,(OptimizeInstructions *)c);
      iVar3 = wasm::Literal::geti32(&_bitsRight_3->value);
      local_d8 = ceilLog2(iVar3);
      puVar8 = std::min<unsigned_int>(&local_d4,&local_d8);
      return *puVar8;
    case AndInt32:
      local_dc = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_e0 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->right,(OptimizeInstructions *)c);
      puVar8 = std::min<unsigned_int>(&local_dc,&local_e0);
      return *puVar8;
    case OrInt32:
    case XorInt32:
      shifts._4_4_ = getMaxBits<wasm::OptimizeInstructions>
                               (_maxBitsRight->left,(OptimizeInstructions *)c);
      shifts._0_4_ = getMaxBits<wasm::OptimizeInstructions>
                               (_maxBitsRight->right,(OptimizeInstructions *)c);
      puVar8 = std::max<unsigned_int>((uint *)((long)&shifts + 4),(uint *)&shifts);
      return *puVar8;
    case ShlInt32:
      local_f0 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (local_f0 == (Const *)0x0) {
        return 0x20;
      }
      shift._4_4_ = 0x20;
      IVar5 = getMaxBits<wasm::OptimizeInstructions>(_maxBitsRight->left,(OptimizeInstructions *)c);
      IVar4 = getEffectiveShifts((Expression *)local_f0);
      shift._0_4_ = IVar5 + IVar4;
      puVar8 = std::min<unsigned_int>((uint *)((long)&shift + 4),(uint *)&shift);
      return *puVar8;
    case ShrSInt32:
      _shifts_2 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_shifts_2 == (Const *)0x0) {
        return 0x20;
      }
      local_124 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      if (local_124 != 0x20) {
        local_12c = getEffectiveShifts((Expression *)_shifts_2);
        puVar8 = std::min<unsigned_int>(&local_12c,&local_124);
        local_128 = *puVar8;
        maxBitsLeft_6 = 0;
        maxBitsRight_2 = local_124 - local_128;
        puVar8 = std::max<unsigned_int>(&maxBitsLeft_6,&maxBitsRight_2);
        return *puVar8;
      }
      return 0x20;
    case ShrUInt32:
      _shifts_1 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_shifts_1 == (Const *)0x0) {
        return 0x20;
      }
      local_104 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_10c = getEffectiveShifts((Expression *)_shifts_1);
      puVar8 = std::min<unsigned_int>(&local_10c,&local_104);
      local_108 = *puVar8;
      local_110 = 0;
      shift_1._4_4_ = local_104 - local_108;
      puVar8 = std::max<unsigned_int>(&local_110,(uint *)((long)&shift_1 + 4));
      return *puVar8;
    case EqInt32:
    case NeInt32:
    case LtSInt32:
    case LtUInt32:
    case LeSInt32:
    case LeUInt32:
    case GtSInt32:
    case GtUInt32:
    case GeSInt32:
    case GeUInt32:
    case EqInt64:
    case NeInt64:
    case LtSInt64:
    case LtUInt64:
    case LeSInt64:
    case LeUInt64:
    case GtSInt64:
    case GtUInt64:
    case GeSInt64:
    case GeUInt64:
    case EqFloat32:
    case NeFloat32:
    case LtFloat32:
    case LeFloat32:
    case GtFloat32:
    case GeFloat32:
    case EqFloat64:
    case NeFloat64:
    case LtFloat64:
    case LeFloat64:
    case GtFloat64:
    case GeFloat64:
      handle_unreachable("relationals handled before",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                         ,0x172);
    case AddInt64:
      local_138 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_13c = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->right,(OptimizeInstructions *)c);
      maxBitsRight_3 = 0x40;
      puVar8 = std::max<unsigned_int>(&local_138,&local_13c);
      maxBitsLeft_7 = *puVar8 + 1;
      puVar8 = std::min<unsigned_int>(&maxBitsRight_3,&maxBitsLeft_7);
      return *puVar8;
    case SubInt64:
    case RotLInt64:
    case RotRInt64:
      return 0x40;
    case MulInt64:
      local_148 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->right,(OptimizeInstructions *)c);
      local_14c = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_150 = 0x40;
      c_5._4_4_ = local_14c + local_148;
      puVar8 = std::min<unsigned_int>(&local_150,(uint *)((long)&c_5 + 4));
      return *puVar8;
    case DivSInt64:
      _bitsRight_4 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight_4 == (Const *)0x0) {
        return 0x40;
      }
      local_164 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      if ((local_164 != 0x40) && (iVar6 = wasm::Literal::geti64(&_bitsRight_4->value), -1 < iVar6))
      {
        local_168 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                              ((Expression *)_bitsRight_4,(DummyLocalInfoProvider *)0x0);
        maxBitsLeft_9 = 0;
        local_170 = (local_164 - local_168) + 1;
        pIVar7 = (Index *)std::max<int>(&maxBitsLeft_9,&local_170);
        return *pIVar7;
      }
      return 0x40;
    case DivUInt64:
      c_6._4_4_ = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      pCStack_180 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (pCStack_180 == (Const *)0x0) {
        return c_6._4_4_;
      }
      local_184 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                            ((Expression *)pCStack_180,(DummyLocalInfoProvider *)0x0);
      local_188 = 0;
      c_7._4_4_ = (c_6._4_4_ - local_184) + 1;
      pIVar7 = (Index *)std::max<int>(&local_188,(int *)((long)&c_7 + 4));
      return *pIVar7;
    case RemSInt64:
      _bitsRight_6 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight_6 == (Const *)0x0) {
        return 0x40;
      }
      c_8._4_4_ = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      if (c_8._4_4_ != 0x40) {
        iVar6 = wasm::Literal::geti64(&_bitsRight_6->value);
        c_8._0_4_ = ceilLog2(iVar6);
        puVar8 = std::min<unsigned_int>((uint *)((long)&c_8 + 4),(uint *)&c_8);
        return *puVar8;
      }
      return 0x40;
    case RemUInt64:
      _bitsRight_7 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight_7 == (Const *)0x0) {
        return 0x40;
      }
      local_1ac = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      iVar6 = wasm::Literal::geti64(&_bitsRight_7->value);
      local_1b0 = ceilLog2(iVar6);
      puVar8 = std::min<unsigned_int>(&local_1ac,&local_1b0);
      return *puVar8;
    case AndInt64:
      local_1b4 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_1b8 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->right,(OptimizeInstructions *)c);
      puVar8 = std::min<unsigned_int>(&local_1b4,&local_1b8);
      return *puVar8;
    case OrInt64:
    case XorInt64:
      shifts_3._4_4_ =
           getMaxBits<wasm::OptimizeInstructions>(_maxBitsRight->left,(OptimizeInstructions *)c);
      shifts_3._0_4_ =
           getMaxBits<wasm::OptimizeInstructions>(_maxBitsRight->right,(OptimizeInstructions *)c);
      puVar8 = std::max<unsigned_int>((uint *)((long)&shifts_3 + 4),(uint *)&shifts_3);
      return *puVar8;
    case ShlInt64:
      pCStack_1c8 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (pCStack_1c8 == (Const *)0x0) {
        return 0x40;
      }
      local_1cc = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_1d0 = 0x40;
      IVar5 = getEffectiveShifts((Expression *)pCStack_1c8);
      shift_2._4_4_ = IVar5 + local_1cc;
      puVar8 = std::min<unsigned_int>(&local_1d0,(uint *)((long)&shift_2 + 4));
      return *puVar8;
    case ShrSInt64:
      _shifts_5 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_shifts_5 == (Const *)0x0) {
        return 0x40;
      }
      local_204 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      if (local_204 != 0x40) {
        local_20c = getEffectiveShifts((Expression *)_shifts_5);
        puVar8 = std::min<unsigned_int>(&local_20c,&local_204);
        local_208 = *puVar8;
        local_210 = 0;
        unary._4_4_ = local_204 - local_208;
        puVar8 = std::max<unsigned_int>(&local_210,(uint *)((long)&unary + 4));
        return *puVar8;
      }
      return 0x40;
    case ShrUInt64:
      _shifts_4 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_shifts_4 == (Const *)0x0) {
        return 0x40;
      }
      local_1e4 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_1ec = getEffectiveShifts((Expression *)_shifts_4);
      puVar8 = std::min<unsigned_int>(&local_1ec,&local_1e4);
      local_1e8 = *puVar8;
      local_1f0 = 0;
      shift_3._4_4_ = local_1e4 - local_1e8;
      puVar8 = std::max<unsigned_int>(&local_1f0,(uint *)((long)&shift_3 + 4));
      return *puVar8;
    default:
    }
  }
  BVar2 = wasm::Type::getBasic
                    ((Type *)&(localInfoProvider_local->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).super_Pass.runner);
  if (BVar2 == unreachable) {
    curr_local._4_4_ = 0x40;
  }
  else if (BVar2 == i32) {
    curr_local._4_4_ = 0x20;
  }
  else {
    if (BVar2 != i64) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                         ,0x1b4);
    }
    curr_local._4_4_ = 0x40;
  }
  return curr_local._4_4_;
}

Assistant:

Index getMaxBits(Expression* curr,
                 LocalInfoProvider* localInfoProvider = nullptr) {
  if (Properties::emitsBoolean(curr)) {
    return 1;
  }
  if (auto* c = curr->dynCast<Const>()) {
    switch (curr->type.getBasic()) {
      case Type::i32:
        return 32 - c->value.countLeadingZeroes().geti32();
      case Type::i64:
        return 64 - c->value.countLeadingZeroes().geti64();
      default:
        WASM_UNREACHABLE("invalid type");
    }
  } else if (auto* binary = curr->dynCast<Binary>()) {
    switch (binary->op) {
      // 32-bit
      case RotLInt32:
      case RotRInt32:
      case SubInt32:
        return 32;
      case AddInt32: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(32), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt32: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(32), maxBitsLeft + maxBitsRight);
      }
      case DivSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // If either side might be negative, then the result will be negative
          if (maxBitsLeft == 32 || c->value.geti32() < 0) {
            return 32;
          }
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return 32;
      }
      case DivUInt32: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return maxBitsLeft;
      }
      case RemSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 32) {
            return 32;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case RemUInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case AndInt32: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt32:
      case XorInt32: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt32: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          return std::min(Index(32),
                          getMaxBits(binary->left, localInfoProvider) +
                            Bits::getEffectiveShifts(shifts));
        }
        return 32;
      }
      case ShrUInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case ShrSInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 32) {
            return 32;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case RotLInt64:
      case RotRInt64:
      case SubInt64:
        return 64;
      case AddInt64: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(64), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt64: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(64), maxBitsLeft + maxBitsRight);
      }
      case DivSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left or right const value is negative
          if (maxBitsLeft == 64 || c->value.geti64() < 0) {
            return 64;
          }
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return 64;
      }
      case DivUInt64: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return maxBitsLeft;
      }
      case RemSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 64) {
            return 64;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case RemUInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case AndInt64: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt64:
      case XorInt64: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt64: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          return std::min(Index(64),
                          Bits::getEffectiveShifts(shifts) + maxBits);
        }
        return 64;
      }
      case ShrUInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      case ShrSInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 64) {
            return 64;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      // comparisons
      case EqInt32:
      case NeInt32:
      case LtSInt32:
      case LtUInt32:
      case LeSInt32:
      case LeUInt32:
      case GtSInt32:
      case GtUInt32:
      case GeSInt32:
      case GeUInt32:

      case EqInt64:
      case NeInt64:
      case LtSInt64:
      case LtUInt64:
      case LeSInt64:
      case LeUInt64:
      case GtSInt64:
      case GtUInt64:
      case GeSInt64:
      case GeUInt64:

      case EqFloat32:
      case NeFloat32:
      case LtFloat32:
      case LeFloat32:
      case GtFloat32:
      case GeFloat32:

      case EqFloat64:
      case NeFloat64:
      case LtFloat64:
      case LeFloat64:
      case GtFloat64:
      case GeFloat64:
        WASM_UNREACHABLE("relationals handled before");
      default: {
      }
    }
  } else if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
        return 6;
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
        return 7;
      case EqZInt32:
      case EqZInt64:
        WASM_UNREACHABLE("relationals handled before");
      case WrapInt64:
      case ExtendUInt32:
        return std::min(Index(32), getMaxBits(unary->value, localInfoProvider));
      case ExtendS8Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(32) : maxBits;
      }
      case ExtendS16Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(32) : maxBits;
      }
      case ExtendS8Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(64) : maxBits;
      }
      case ExtendS16Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(64) : maxBits;
      }
      case ExtendS32Int64:
      case ExtendSInt32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 32 ? Index(64) : maxBits;
      }
      default: {
      }
    }
  } else if (auto* set = curr->dynCast<LocalSet>()) {
    // a tee passes through the value
    return getMaxBits(set->value, localInfoProvider);
  } else if (auto* get = curr->dynCast<LocalGet>()) {
    // TODO: Should this be optional?
    assert(localInfoProvider);
    return localInfoProvider->getMaxBitsForLocal(get);
  } else if (auto* load = curr->dynCast<Load>()) {
    // if signed, then the sign-extension might fill all the bits
    // if unsigned, then we have a limit
    if (LoadUtils::isSignRelevant(load) && !load->signed_) {
      return 8 * load->bytes;
    }
  }
  switch (curr->type.getBasic()) {
    case Type::i32:
      return 32;
    case Type::i64:
      return 64;
    case Type::unreachable:
      return 64; // not interesting, but don't crash
    default:
      WASM_UNREACHABLE("invalid type");
  }
}